

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HexDump.cpp
# Opt level: O2

void arangodb::velocypack::HexDump::appendHex(string *result,uint8_t value)

{
  char cVar1;
  byte bVar2;
  
  cVar1 = (value >> 4) + 0x57;
  if (value < 0xa0) {
    cVar1 = (value >> 4) + 0x30;
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (result,cVar1);
  bVar2 = value & 0xf;
  cVar1 = bVar2 + 0x57;
  if (bVar2 < 10) {
    cVar1 = bVar2 + 0x30;
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (result,cVar1);
  return;
}

Assistant:

void HexDump::appendHex(std::string& result, uint8_t value) {
  uint8_t x = value / 16;
  result.push_back((x < 10 ? ('0' + x) : ('a' + x - 10)));
  x = value % 16;
  result.push_back((x < 10 ? ('0' + x) : ('a' + x - 10)));
}